

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O0

void __thiscall
QPDFObjectHandle::replaceStreamData
          (QPDFObjectHandle *this,function<void_(Pipeline_*)> *provider,QPDFObjectHandle *filter,
          QPDFObjectHandle *decode_parms)

{
  FunctionProvider *this_00;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> local_88;
  QPDFObjectHandle local_78;
  undefined1 local_65;
  function<void_(Pipeline_*)> local_58;
  undefined1 local_38 [8];
  shared_ptr<QPDFObjectHandle::StreamDataProvider> sdp;
  QPDFObjectHandle *decode_parms_local;
  QPDFObjectHandle *filter_local;
  function<void_(Pipeline_*)> *provider_local;
  QPDFObjectHandle *this_local;
  
  sdp.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)decode_parms;
  this_00 = (FunctionProvider *)operator_new(0x50);
  local_65 = 1;
  std::function<void_(Pipeline_*)>::function(&local_58,provider);
  anon_unknown.dwarf_514117::FunctionProvider::FunctionProvider(this_00,&local_58);
  local_65 = 0;
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::
  shared_ptr<(anonymous_namespace)::FunctionProvider,void>
            ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)local_38,this_00);
  std::function<void_(Pipeline_*)>::~function(&local_58);
  as_stream(&local_78,(typed)this);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::shared_ptr
            (&local_88,(shared_ptr<QPDFObjectHandle::StreamDataProvider> *)local_38);
  ::qpdf::Stream::replaceStreamData
            ((Stream *)&local_78,&local_88,filter,
             (QPDFObjectHandle *)
             sdp.
             super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr(&local_88);
  ::qpdf::Stream::~Stream((Stream *)&local_78);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr
            ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)local_38);
  return;
}

Assistant:

void
QPDFObjectHandle::replaceStreamData(
    std::function<void(Pipeline*)> provider,
    QPDFObjectHandle const& filter,
    QPDFObjectHandle const& decode_parms)
{
    auto sdp = std::shared_ptr<StreamDataProvider>(new FunctionProvider(provider));
    as_stream(error).replaceStreamData(sdp, filter, decode_parms);
}